

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O2

bool ON_EvCurvature1Der(ON_3dVector *D1,ON_3dVector *D2,ON_3dVector *D3,ON_3dVector *T,
                       ON_3dVector *K,double *kprime,double *torsion)

{
  double dVar1;
  double __x;
  double dVar2;
  double dVar3;
  ON_3dVector qprime;
  ON_3dVector q;
  double local_b0;
  ON_3dVector local_90;
  ON_3dVector local_78;
  ON_3dVector local_60;
  ON_3dVector local_48;
  
  dVar1 = ON_3dVector::Length(D1);
  if (0.0 < dVar1) {
    operator*(&local_78,1.0 / dVar1,D1);
    T->z = local_78.z;
    T->x = local_78.x;
    T->y = local_78.y;
    ON_CrossProduct(&local_78,D1,D2);
    __x = ON_3dVector::LengthSquared(&local_78);
    dVar2 = ON_3dVector::operator*(D2,T);
    operator*(&local_60,dVar2,T);
    ON_3dVector::operator-(&local_48,D2,&local_60);
    operator*(&local_90,1.0 / (dVar1 * dVar1),&local_48);
    K->z = local_90.z;
    K->x = local_90.x;
    K->y = local_90.y;
    if (kprime != (double *)0x0) {
      ON_CrossProduct(&local_90,D1,D3);
      if (__x <= 0.0) {
        local_b0 = ON_3dVector::Length(&local_90);
        dVar1 = ON_3dVector::Length(D1);
        dVar1 = pow(dVar1,3.0);
      }
      else {
        dVar1 = ON_3dVector::operator*(&local_78,&local_90);
        dVar2 = ON_3dVector::LengthSquared(D1);
        dVar3 = ON_3dVector::operator*(D1,D2);
        local_b0 = dVar2 * dVar1 + __x * -3.0 * dVar3;
        if (__x < 0.0) {
          dVar2 = sqrt(__x);
        }
        else {
          dVar2 = SQRT(__x);
        }
        dVar1 = ON_3dVector::Length(D1);
        dVar1 = pow(dVar1,5.0);
        dVar1 = dVar1 * dVar2;
      }
      *kprime = local_b0 / dVar1;
    }
    if (torsion == (double *)0x0) {
      return kprime != (double *)0x0;
    }
    if (0.0 < __x) {
      dVar1 = ON_3dVector::operator*(&local_78,D3);
      *torsion = dVar1 / __x;
      return true;
    }
  }
  return false;
}

Assistant:

bool
ON_EvCurvature1Der(
  const ON_3dVector& D1, // first derivative
  const ON_3dVector& D2, // second derivative
  const ON_3dVector& D3, // third derivative
  ON_3dVector& T,       // Unit tangent returned here
  ON_3dVector& K,       // curvature vector(k*N). curvature k = K.Length() and Normal N=K.Unitize()
  double* kprime,       // first derivative of k
  double* torsion)        // torsion 
{
  bool rc = false;
  double dsdt = D1.Length();
  if (dsdt > 0)
  {
    T = (1 / dsdt) * D1;
    // Differentiate the formula k = | q | / |D1|^3, where q = D1 x D2
    ON_3dVector q = ON_CrossProduct(D1, D2);
    double qlen2 = q.LengthSquared();
    double dsdt2 = dsdt * dsdt;
    K = (1.0/dsdt2)  * (D2 - (D2*T) * T);
    if (kprime)
    {
      ON_3dVector qprime = ON_CrossProduct(D1, D3);
      if (qlen2 > 0)
      {
        *kprime = ((q * qprime) * D1.LengthSquared() - 3 * qlen2 * (D1 * D2)) /
          (sqrt(qlen2) * pow(D1.Length(), 5.0));
      }
      else
        *kprime = qprime.Length() / pow(D1.Length(), 3);
      rc = true;
    }
    if (torsion)
    {
      if (qlen2 > 0)
      {
        *torsion = q * D3 / qlen2;
        rc = true;
      }
      else
        rc = false;
    }
    
  }
  return rc;
}